

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O3

void __thiscall crnlib::spinlock::spinlock(spinlock *this)

{
  int iVar1;
  
  iVar1 = pthread_spin_init(&this->m_spinlock,0);
  if (iVar1 != 0) {
    crnlib_fail("\"spinlock: pthread_spin_init() failed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_threading_pthreads.cpp"
                ,0xc6);
    return;
  }
  return;
}

Assistant:

spinlock::spinlock() {
#if !defined(__APPLE__)
  if (pthread_spin_init(&m_spinlock, 0)) {
    CRNLIB_FAIL("spinlock: pthread_spin_init() failed");
  }
#else
  m_lock = new os_unfair_lock();
  *m_lock = OS_UNFAIR_LOCK_INIT;
#endif
}